

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *__s;
  clock_t cVar4;
  clock_t cVar5;
  bool *pbVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  char *pcVar10;
  
  if (argc < 2) {
    pcVar10 = "xxh3";
    printf("No test hash given on command line, testing %s.\n","xxh3");
    puts(
        "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash"
        );
  }
  else {
    uVar2 = 1;
    pcVar8 = "xxh3";
    do {
      pcVar10 = argv[uVar2];
      if ((*pcVar10 == '-') && (pcVar10[1] == '-')) {
        iVar1 = strcmp(pcVar10,"--help");
        if (iVar1 == 0) {
          puts(
              "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash"
              );
          goto LAB_00108ea0;
        }
        iVar1 = strcmp(pcVar10,"--list");
        if (iVar1 == 0) {
          lVar7 = 0x20;
          do {
            printf("%-16s\t\"%s\" %s\n",*(undefined8 *)((long)quality_str + lVar7 + 0x10),
                   *(undefined8 *)(lVar7 + 0x1d0378),
                   quality_str[*(uint *)((long)&g_hashes[0].hash + lVar7)]);
            lVar7 = lVar7 + 0x28;
          } while (lVar7 != 0x1790);
LAB_00108ea0:
          exit(0);
        }
        iVar1 = strcmp(pcVar10,"--listnames");
        if (iVar1 == 0) {
          lVar7 = 0x10;
          do {
            puts(*(char **)((long)&g_hashes[0].hash + lVar7));
            lVar7 = lVar7 + 0x28;
          } while (lVar7 != 0x1780);
          goto LAB_00108ea0;
        }
        iVar1 = strcmp(pcVar10,"--tests");
        if (iVar1 == 0) {
          puts("Valid tests:");
          lVar7 = 8;
          do {
            printf("  %s\n",*(undefined8 *)((long)&g_testopts[0].var + lVar7));
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0x148);
          goto LAB_00108ea0;
        }
        iVar1 = strcmp(pcVar10,"--verbose");
        pbVar6 = &g_drawDiagram;
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar10,"--extra");
          pbVar6 = &g_testExtra;
          if (iVar1 != 0) {
            iVar1 = strncmp(pcVar10,"--test=",6);
            if (iVar1 != 0) {
              puts("Invalid command ");
              pcVar8 = 
              "Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n       [--test=Speed,...] hash"
              ;
LAB_00108de5:
              puts(pcVar8);
              exit(1);
            }
            bVar9 = false;
            g_testAll = false;
            __s = pcVar10 + 7;
            do {
              pcVar3 = strchr(__s,0x2c);
              pcVar10 = __s;
              if (pcVar3 != (char *)0x0) {
                __s = strndup(__s,(long)pcVar3 - (long)__s);
                pcVar10 = pcVar3 + 1;
              }
              lVar7 = 8;
              do {
                iVar1 = strcmp(__s,*(char **)((long)&g_testopts[0].var + lVar7));
                if (iVar1 == 0) {
                  **(undefined1 **)(lVar7 + 0x1d0218) = 1;
                  goto LAB_00108cb5;
                }
                lVar7 = lVar7 + 0x10;
              } while (lVar7 != 0x148);
              if (!bVar9) {
                printf("Invalid option: --test=%s\n",__s);
                printf("Valid tests: --test=%s",g_testopts[0].name);
                lVar7 = 0x18;
                do {
                  printf(",%s",*(undefined8 *)((long)&g_testopts[0].var + lVar7));
                  lVar7 = lVar7 + 0x10;
                } while (lVar7 != 0x148);
                pcVar8 = " ";
                goto LAB_00108de5;
              }
LAB_00108cb5:
              bVar9 = true;
              __s = pcVar10;
              pcVar10 = pcVar8;
            } while (pcVar3 != (char *)0x0);
            goto LAB_00108cdb;
          }
        }
        *pbVar6 = true;
        pcVar10 = pcVar8;
      }
LAB_00108cdb:
      uVar2 = uVar2 + 1;
      pcVar8 = pcVar10;
    } while (uVar2 != (uint)argc);
  }
  cVar4 = clock();
  testHash(pcVar10);
  cVar5 = clock();
  putchar(10);
  fflush((FILE *)0x0);
  if (g_testAll == false) {
    main_cold_1();
  }
  else {
    printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",(ulong)g_inputVCode,
           (ulong)g_outputVCode,(ulong)g_resultVCode);
    printf("Verification value is 0x%08x - Testing took %f seconds\n",
           (double)((int)cVar5 - (int)cVar4) / 1000000.0,(ulong)g_verify);
    puts("-------------------------------------------------------------------------------");
  }
  fflush((FILE *)0x0);
  return 0;
}

Assistant:

int main ( int argc, const char ** argv )
{
#ifdef DEBUG
  const char * defaulthash = "wysha";
#elif defined(__x86_64__) || defined(_M_X64) || defined(_X86_64_)
  const char * defaulthash = "xxh3";
#else
  const char * defaulthash = "wyhash";
#endif
  const char * hashToTest = defaulthash;

  if (argc < 2) {
    printf("No test hash given on command line, testing %s.\n", hashToTest);
    printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
           "       [--test=Speed,...] hash\n");
  }

  for (int argnb = 1; argnb < argc; argnb++) {
    const char* const arg = argv[argnb];
    if (strncmp(arg,"--", 2) == 0) {
      // This is a command
      if (strcmp(arg,"--help") == 0) {
        printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
               "       [--test=Speed,...] hash\n");
        exit(0);
      }
      if (strcmp(arg,"--list") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%-16s\t\"%s\" %s\n", g_hashes[i].name, g_hashes[i].desc, quality_str[g_hashes[i].quality]);
        }
        exit(0);
      }
      if (strcmp(arg,"--listnames") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%s\n", g_hashes[i].name);
        }
        exit(0);
      }
      if (strcmp(arg,"--tests") == 0) {
        printf("Valid tests:\n");
        for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
          printf("  %s\n", g_testopts[i].name);
        }
        exit(0);
      }
      if (strcmp(arg,"--verbose") == 0) {
        g_drawDiagram = true;
        continue;
      }
      if (strcmp(arg,"--extra") == 0) {
        g_testExtra = true;
        continue;
      }
      /* default: --test=All. comma seperated list of options */
      if (strncmp(arg,"--test=", 6) == 0) {
        char *opt = (char *)&arg[7];
        char *rest = opt;
        char *p;
        bool found = false;
        g_testAll = false;
        do {
          if ((p = strchr(rest, ','))) {
            opt = strndup(rest, p-rest);
            rest = p+1;
          } else {
            opt = rest;
          }
          for (size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
            if (strcmp(opt, g_testopts[i].name) == 0) {
              g_testopts[i].var = true; found = true; break;
            }
          }
          if (!found) {
            printf("Invalid option: --test=%s\n", opt);
            printf("Valid tests: --test=%s", g_testopts[0].name);
            for(size_t i = 1; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
              printf(",%s", g_testopts[i].name);
            }
            printf(" \n");
            exit(1);
          }
        } while (p);
        continue;
      }
      // invalid command
      printf("Invalid command \n");
      printf("Usage: SMHasher [--list][--listnames][--tests] [--verbose][--extra]\n"
             "       [--test=Speed,...] hash\n");
      exit(1);
    }
    // Not a command ? => interprested as hash name
    hashToTest = arg;
  }

  // Code runs on the 3rd CPU by default? only for speed tests
  //SetAffinity((1 << 2));
  //SelfTest();

  int timeBegin = clock();

  testHash(hashToTest);

  int timeEnd = clock();

  printf("\n");
  fflush(NULL);
  if (g_testAll) {
    printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
    printf("Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
    printf("-------------------------------------------------------------------------------\n");
  } else {
    fprintf(stderr, "Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
    fprintf(stderr, "Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
  }
    fflush(NULL);
  return 0;
}